

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

void ucnv_getInvalidChars_63(UConverter *converter,char *errBytes,int8_t *len,UErrorCode *err)

{
  char cVar1;
  UBool UVar2;
  UErrorCode *err_local;
  int8_t *len_local;
  char *errBytes_local;
  UConverter *converter_local;
  
  if ((err != (UErrorCode *)0x0) && (UVar2 = U_FAILURE(*err), UVar2 == '\0')) {
    if ((len == (int8_t *)0x0) || ((errBytes == (char *)0x0 || (converter == (UConverter *)0x0)))) {
      *err = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else if (*len < converter->invalidCharLength) {
      *err = U_INDEX_OUTOFBOUNDS_ERROR;
    }
    else {
      cVar1 = converter->invalidCharLength;
      *len = cVar1;
      if ('\0' < cVar1) {
        memcpy(errBytes,converter->invalidCharBuffer,(long)*len);
      }
    }
  }
  return;
}

Assistant:

U_CAPI void  U_EXPORT2
ucnv_getInvalidChars (const UConverter * converter,
                      char *errBytes,
                      int8_t * len,
                      UErrorCode * err)
{
    if (err == NULL || U_FAILURE(*err))
    {
        return;
    }
    if (len == NULL || errBytes == NULL || converter == NULL)
    {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    if (*len < converter->invalidCharLength)
    {
        *err = U_INDEX_OUTOFBOUNDS_ERROR;
        return;
    }
    if ((*len = converter->invalidCharLength) > 0)
    {
        uprv_memcpy (errBytes, converter->invalidCharBuffer, *len);
    }
}